

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

int katherine_set_dacs(katherine_device_t *device,katherine_dacs_t *dacs)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  int i;
  long lVar3;
  int5 local_38;
  undefined3 uStack_33;
  
  _local_38 = in_RAX;
  iVar1 = katherine_udp_mutex_lock(&device->control_socket);
  if (iVar1 == 0) {
    lVar3 = 0;
    uVar2 = extraout_RDX;
    do {
      if (lVar3 == 0x12) {
        iVar1 = katherine_cmd60(&device->control_socket,'\x01',(char)uVar2);
        if (iVar1 == 0) {
          iVar1 = katherine_cmd_wait_ack(&device->control_socket);
        }
        break;
      }
      _local_38 = CONCAT35(0x400,(uint5)(byte)lVar3 << 0x20);
      katherine_cmd_long((char *)&local_38,(ulong)dacs->array[lVar3]);
      iVar1 = katherine_udp_send_exact(&device->control_socket,&local_38,8);
      if (iVar1 != 0) break;
      iVar1 = katherine_cmd_wait_ack(&device->control_socket);
      lVar3 = lVar3 + 1;
      uVar2 = extraout_RDX_00;
    } while (iVar1 == 0);
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  return iVar1;
}

Assistant:

int
katherine_set_dacs(katherine_device_t *device, const katherine_dacs_t *dacs)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    for (int i = 0; i < 18; ++i) {
        char cmd[8] = {0};
        cmd[6] = CMD_TYPE_INTERNAL_DAC_SETTINGS;
        cmd[4] = (char) i;
        katherine_cmd_long(cmd, dacs->array[i]);

        res = katherine_cmd(&device->control_socket, &cmd, sizeof(cmd));
        if (res) goto err;

        res = katherine_cmd_wait_ack(&device->control_socket);
        if (res) goto err;
    }

    res = katherine_cmd_hw_internal_dac_update(&device->control_socket);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}